

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O0

sgr_ostream_wrapper * __thiscall
cpp_sgr::sgr_ostream_wrapper::operator<<(sgr_ostream_wrapper *this,sgr *c)

{
  string local_38;
  sgr *local_18;
  sgr *c_local;
  sgr_ostream_wrapper *this_local;
  
  local_18 = c;
  c_local = (sgr *)this;
  sgr::toString_abi_cxx11_(&local_38,c);
  std::operator<<(&this->stream,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

sgr_ostream_wrapper & sgr_ostream_wrapper::operator<<(const sgr & c)
	{
		stream << c.toString();
		return *this;
	}